

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O3

void __thiscall miniros::ServicePublication::dropAllConnections(ServicePublication *this)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  pointer psVar4;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  local_links;
  vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  local_38;
  
  local_38.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->client_links_mutex_);
  if (iVar3 == 0) {
    psVar4 = (this->client_links_).
             super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->client_links_).
             super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->client_links_).
         super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->client_links_).
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->client_links_).
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->client_links_).
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar4;
    local_38.
    super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->client_links_mutex_);
    for (; psVar4 != psVar1; psVar4 = psVar4 + 1) {
      peVar2 = (psVar4->super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar4->super___shared_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      Connection::drop((peVar2->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       Destructing);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::
    vector<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
    ::~vector(&local_38);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void ServicePublication::dropAllConnections()
{
  // Swap our client_links_ list with a local one so we can only lock for a short period of time, because a
  // side effect of our calling drop() on connections can be re-locking the client_links_ mutex
  std::vector<ServiceClientLinkPtr> local_links;

  {
    std::scoped_lock<std::mutex> lock(client_links_mutex_);
    local_links.swap(client_links_);
  }

  for (ServiceClientLinkPtr link: local_links)
    link->getConnection()->drop(Connection::Destructing);
}